

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSymm.c
# Opt level: O1

int zdd_group_move(DdManager *table,int x,int y,Move **moves)

{
  DdSubtable *pDVar1;
  Move *pMVar2;
  Move *pMVar3;
  ulong uVar4;
  int iVar5;
  DdNode *pDVar6;
  uint uVar7;
  ulong uVar8;
  DdHalfWord DVar9;
  DdHalfWord DVar11;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint x_00;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar10;
  ulong uVar12;
  
  uVar18 = (ulong)(uint)y;
  pDVar1 = table->subtableZ;
  uVar15 = (ulong)(int)pDVar1[x].next;
  uVar7 = pDVar1[y].next;
  do {
    uVar14 = (ulong)uVar7;
    uVar7 = pDVar1[(int)uVar7].next;
  } while (uVar7 != y);
  uVar12 = 0xffffffff;
  DVar11 = 0xffffffff;
  uVar10 = 0xffffffff;
  DVar9 = 0xffffffff;
  uVar8 = (long)x;
  if (x <= y) {
    do {
      uVar4 = uVar8;
      uVar17 = uVar18;
      if ((long)uVar15 < (long)(int)uVar18) {
        do {
          uVar18 = uVar4;
          uVar10 = uVar17 & 0xffffffff;
          uVar16 = (uint)uVar17;
          pDVar1 = table->subtableZ;
          uVar7 = pDVar1[uVar18].next;
          uVar12 = uVar15 & 0xffffffff;
          do {
            iVar5 = (int)uVar12;
            uVar12 = (ulong)pDVar1[iVar5].next;
            x_00 = (uint)uVar18;
          } while (pDVar1[iVar5].next != x_00);
          if (uVar7 == x_00) {
            uVar7 = uVar16;
          }
          pDVar1[iVar5].next = uVar16;
          uVar13 = pDVar1[(int)uVar16].next;
          if (pDVar1[(int)uVar16].next == uVar16) {
            uVar13 = x_00;
          }
          pDVar1[uVar18].next = uVar13;
          uVar12 = uVar18 & 0xffffffff;
          if ((uint)uVar14 != uVar16) {
            pDVar1[(int)(uint)uVar14].next = x_00;
            uVar12 = uVar14;
          }
          pDVar1[(int)uVar16].next = uVar7;
          iVar5 = cuddZddSwapInPlace(table,x_00,uVar16);
          if (iVar5 == 0) goto LAB_0092efc8;
          uVar4 = uVar18 - 1;
          uVar14 = uVar12;
          uVar17 = uVar18;
        } while ((long)uVar15 < (long)uVar18);
        uVar12 = uVar18 & 0xffffffff;
      }
      DVar9 = (DdHalfWord)uVar10;
      DVar11 = (DdHalfWord)uVar12;
      uVar16 = (uint)uVar18;
      uVar7 = table->subtableZ[(int)uVar16].next;
      uVar18 = uVar18 & 0xffffffff;
      if (uVar16 < uVar7) {
        uVar18 = (ulong)uVar7;
      }
      uVar14 = uVar15 & 0xffffffff;
      uVar15 = uVar15 + 1;
      iVar5 = (int)uVar8;
      uVar8 = uVar8 + 1;
    } while (iVar5 < (int)uVar18);
  }
  pDVar6 = cuddDynamicAllocNode(table);
  if (pDVar6 == (DdNode *)0x0) {
LAB_0092efc8:
    uVar7 = 0;
    pMVar3 = *moves;
    while (pMVar3 != (Move *)0x0) {
      pMVar2 = pMVar3->next;
      pMVar3->y = 0;
      *(DdNode **)&pMVar3->flags = table->nextFree;
      table->nextFree = (DdNode *)*moves;
      *moves = pMVar2;
      pMVar3 = pMVar2;
    }
  }
  else {
    pDVar6->index = DVar11;
    pDVar6->ref = DVar9;
    uVar7 = table->keysZ;
    *(uint *)((long)&pDVar6->next + 4) = uVar7;
    (pDVar6->type).kids.T = (DdNode *)*moves;
    *moves = (Move *)pDVar6;
  }
  return uVar7;
}

Assistant:

static int
zdd_group_move(
  DdManager * table,
  int  x,
  int  y,
  Move ** moves)
{
    Move        *move;
    int         size;
    int         i, temp, gxtop, gxbot, gybot, yprev;
    int         swapx = -1, swapy = -1;

#ifdef DD_DEBUG
    assert(x < y);      /* we assume that x < y */
#endif
    /* Find top and bottom for the two groups. */
    gxtop = table->subtableZ[x].next;
    gxbot = x;
    gybot = table->subtableZ[y].next;
    while (table->subtableZ[gybot].next != (unsigned) y)
        gybot = table->subtableZ[gybot].next;
    yprev = gybot;

    while (x <= y) {
        while (y > gxtop) {
            /* Set correct symmetries. */
            temp = table->subtableZ[x].next;
            if (temp == x)
                temp = y;
            i = gxtop;
            for (;;) {
                if (table->subtableZ[i].next == (unsigned) x) {
                    table->subtableZ[i].next = y;
                    break;
                } else {
                    i = table->subtableZ[i].next;
                }
            }
            if (table->subtableZ[y].next != (unsigned) y) {
                table->subtableZ[x].next = table->subtableZ[y].next;
            } else {
                table->subtableZ[x].next = x;
            }

            if (yprev != y) {
                table->subtableZ[yprev].next = x;
            } else {
                yprev = x;
            }
            table->subtableZ[y].next = temp;

            size = cuddZddSwapInPlace(table, x, y);
            if (size == 0)
                goto zdd_group_moveOutOfMem;
            swapx = x;
            swapy = y;
            y = x;
            x--;
        } /* while y > gxtop */

        /* Trying to find the next y. */
        if (table->subtableZ[y].next <= (unsigned) y) {
            gybot = y;
        } else {
            y = table->subtableZ[y].next;
        }

        yprev = gxtop;
        gxtop++;
        gxbot++;
        x = gxbot;
    } /* while x <= y, end of group movement */
    move = (Move *)cuddDynamicAllocNode(table);
    if (move == NULL)
        goto zdd_group_moveOutOfMem;
    move->x = swapx;
    move->y = swapy;
    move->size = table->keysZ;
    move->next = *moves;
    *moves = move;

    return(table->keysZ);

zdd_group_moveOutOfMem:
    while (*moves != NULL) {
        move = (*moves)->next;
        cuddDeallocMove(table, *moves);
        *moves = move;
    }
    return(0);

}